

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

bool Imf_3_2::isValidCompression(Compression c)

{
  Compression c_local;
  
  return c < NUM_COMPRESSION_METHODS;
}

Assistant:

bool
isValidCompression (Compression c)
{
    switch (c)
    {
        case NO_COMPRESSION:
        case RLE_COMPRESSION:
        case ZIPS_COMPRESSION:
        case ZIP_COMPRESSION:
        case PIZ_COMPRESSION:
        case PXR24_COMPRESSION:
        case B44_COMPRESSION:
        case B44A_COMPRESSION:
        case DWAA_COMPRESSION:
        case DWAB_COMPRESSION: return true;

        default: return false;
    }
}